

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall HighsMipSolverData::basisTransfer(HighsMipSolverData *this)

{
  value_type vVar1;
  long lVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  const_reference pvVar6;
  reference pvVar7;
  HighsPostsolveStack *this_00;
  long *in_RDI;
  HighsBasisStatus status_1;
  HighsInt i_1;
  HighsBasisStatus status;
  HighsInt i;
  HighsInt numCol;
  HighsInt numRow;
  undefined4 in_stack_ffffffffffffffa8;
  HighsInt in_stack_ffffffffffffffac;
  HighsPostsolveStack *in_stack_ffffffffffffffb0;
  int local_20;
  int local_18;
  
  if (*(long *)(*in_RDI + 0xc0) != 0) {
    HVar3 = HighsMipSolver::numRow((HighsMipSolver *)*in_RDI);
    HVar4 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::assign
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
               in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),(value_type *)0x62761c)
    ;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::assign
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
               in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),(value_type *)0x627640)
    ;
    *(undefined1 *)(in_RDI + 0xcd2) = 1;
    *(undefined1 *)((long)in_RDI + 0x6691) = 1;
    *(undefined1 *)((long)in_RDI + 0x6692) = 1;
    for (local_18 = 0; local_18 < HVar3; local_18 = local_18 + 1) {
      lVar2 = *(long *)(*in_RDI + 0xc0);
      HVar5 = presolve::HighsPostsolveStack::getOrigRowIndex
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (lVar2 + 0x48),(long)HVar5);
      vVar1 = *pvVar6;
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDI + 0xcdb),(long)local_18);
      *pvVar7 = vVar1;
    }
    for (local_20 = 0; local_20 < HVar4; local_20 = local_20 + 1) {
      this_00 = (HighsPostsolveStack *)(*(long *)(*in_RDI + 0xc0) + 0x30);
      HVar3 = presolve::HighsPostsolveStack::getOrigColIndex(this_00,in_stack_ffffffffffffffac);
      pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)this_00,
                          (long)HVar3);
      vVar1 = *pvVar6;
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDI + 0xcd8),(long)local_20);
      *pvVar7 = vVar1;
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::basisTransfer() {
  // if a root basis is given, construct a basis for the root LP from
  // in the reduced problem space after presolving
  if (mipsolver.rootbasis) {
    const HighsInt numRow = mipsolver.numRow();
    const HighsInt numCol = mipsolver.numCol();
    firstrootbasis.col_status.assign(numCol, HighsBasisStatus::kNonbasic);
    firstrootbasis.row_status.assign(numRow, HighsBasisStatus::kNonbasic);
    firstrootbasis.valid = true;
    firstrootbasis.alien = true;
    firstrootbasis.useful = true;

    for (HighsInt i = 0; i < numRow; ++i) {
      HighsBasisStatus status =
          mipsolver.rootbasis->row_status[postSolveStack.getOrigRowIndex(i)];
      firstrootbasis.row_status[i] = status;
    }

    for (HighsInt i = 0; i < numCol; ++i) {
      HighsBasisStatus status =
          mipsolver.rootbasis->col_status[postSolveStack.getOrigColIndex(i)];
      firstrootbasis.col_status[i] = status;
    }
  }
}